

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSeq.c
# Opt level: O2

Vec_Ptr_t * Sim_SimulateSeqModel(Abc_Ntk_t *pNtk,int nFrames,int *pModel)

{
  void *pvVar1;
  uint *puVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Vec_Ptr_t *vInfo;
  Abc_Obj_t *pAVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  
  vInfo = Sim_UtilInfoAlloc(pNtk->vObjs->nSize,nFrames,0);
  pAVar6 = Abc_AigConst1(pNtk);
  Sim_UtilSetConst((uint *)vInfo->pArray[pAVar6->Id],nFrames,1);
  uVar8 = 0;
  if (0 < nFrames) {
    uVar8 = (ulong)(uint)nFrames;
  }
  for (iVar9 = 0; iVar9 < pNtk->vPis->nSize; iVar9 = iVar9 + 1) {
    pAVar6 = Abc_NtkPi(pNtk,iVar9);
    pvVar1 = vInfo->pArray[pAVar6->Id];
    for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      *(uint *)((long)pvVar1 + uVar7 * 4) =
           -(uint)(pModel[pNtk->vPis->nSize * (int)uVar7 + iVar9] != 0);
    }
  }
  for (iVar9 = 0; iVar9 < pNtk->vBoxes->nSize; iVar9 = iVar9 + 1) {
    pAVar6 = Abc_NtkBox(pNtk,iVar9);
    if ((*(uint *)&pAVar6->field_0x14 & 0xf) == 8) {
      puVar2 = (uint *)vInfo->pArray[pAVar6->Id];
      iVar3 = Abc_LatchIsInit0(pAVar6);
      uVar4 = 0;
      if (iVar3 == 0) {
        iVar3 = Abc_LatchIsInit1(pAVar6);
        uVar4 = 0xffffffff;
        if (iVar3 == 0) {
          iVar3 = rand();
          iVar5 = rand();
          uVar4 = rand();
          uVar4 = uVar4 ^ iVar5 << 0xc ^ iVar3 << 0x18;
        }
      }
      *puVar2 = uVar4;
    }
  }
  for (iVar9 = 0; (int)uVar8 != iVar9; iVar9 = iVar9 + 1) {
    Sim_SimulateSeqFrame(vInfo,pNtk,iVar9,1,(uint)(iVar9 < nFrames + -1));
  }
  return vInfo;
}

Assistant:

Vec_Ptr_t * Sim_SimulateSeqModel( Abc_Ntk_t * pNtk, int nFrames, int * pModel )
{
    Vec_Ptr_t * vInfo;
    Abc_Obj_t * pNode;
    unsigned * pUnsigned;
    int i, k;
    vInfo = Sim_UtilInfoAlloc( Abc_NtkObjNumMax(pNtk), nFrames, 0 );
    // set the constant data
    pNode = Abc_AigConst1(pNtk);
    Sim_UtilSetConst( Sim_SimInfoGet(vInfo,pNode), nFrames, 1 );
    // set the random PI data
    Abc_NtkForEachPi( pNtk, pNode, i )
    {
        pUnsigned = Sim_SimInfoGet(vInfo,pNode);
        for ( k = 0; k < nFrames; k++ )
            pUnsigned[k] = pModel[k * Abc_NtkPiNum(pNtk) + i] ? ~((unsigned)0) : 0;
    }
    // set the initial state data
    Abc_NtkForEachLatch( pNtk, pNode, i )
    {
        pUnsigned = Sim_SimInfoGet(vInfo,pNode);
        if ( Abc_LatchIsInit0(pNode) )
            pUnsigned[0] = 0;
        else if ( Abc_LatchIsInit1(pNode) )
            pUnsigned[0] = ~((unsigned)0);
        else 
            pUnsigned[0] = SIM_RANDOM_UNSIGNED;
    }
    // simulate the nodes for the given number of timeframes
    for ( i = 0; i < nFrames; i++ )
        Sim_SimulateSeqFrame( vInfo, pNtk, i, 1, (int)(i < nFrames-1) );
/*
    // print the simulated values
    for ( i = 0; i < nFrames; i++ )
    {
        printf( "Frame %d : ", i+1 );
        Abc_NtkForEachPi( pNtk, pNode, k )
            printf( "%d", Sim_SimInfoGet(vInfo,pNode)[i] > 0 );
        printf( " " );
        Abc_NtkForEachLatch( pNtk, pNode, k )
            printf( "%d", Sim_SimInfoGet(vInfo,pNode)[i] > 0 );
        printf( " " );
        Abc_NtkForEachPo( pNtk, pNode, k )
            printf( "%d", Sim_SimInfoGet(vInfo,pNode)[i] > 0 );
        printf( "\n" );
    }
    printf( "\n" );
*/
    return vInfo;
}